

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  FieldDescriptorProto *pFVar4;
  size_t sVar5;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  DescriptorProto_ExtensionRange *value_01;
  OneofDescriptorProto *value_02;
  DescriptorProto_ReservedRange *value_03;
  string *psVar6;
  int cached_size;
  int n;
  int i_7;
  uint i_6;
  uint count_6;
  uint i_5;
  uint count_5;
  uint i_4;
  uint count_4;
  uint i_3;
  uint count_3;
  uint i_2;
  uint count_2;
  uint i_1;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  DescriptorProto *this_local;
  
  _i = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = DescriptorProto::unknown_fields(this);
    _i = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = field_size(this);
  _i = uVar2 + _i;
  for (i_1 = 0; i_1 < uVar2; i_1 = i_1 + 1) {
    pFVar4 = field(this,i_1);
    sVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (pFVar4);
    _i = sVar5 + _i;
  }
  uVar2 = nested_type_size(this);
  _i = uVar2 + _i;
  for (i_2 = 0; i_2 < uVar2; i_2 = i_2 + 1) {
    value = nested_type(this,i_2);
    sVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::DescriptorProto>(value)
    ;
    _i = sVar5 + _i;
  }
  uVar2 = enum_type_size(this);
  _i = uVar2 + _i;
  for (i_3 = 0; i_3 < uVar2; i_3 = i_3 + 1) {
    value_00 = enum_type(this,i_3);
    sVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumDescriptorProto>
                      (value_00);
    _i = sVar5 + _i;
  }
  uVar2 = extension_range_size(this);
  _i = uVar2 + _i;
  for (i_4 = 0; i_4 < uVar2; i_4 = i_4 + 1) {
    value_01 = extension_range(this,i_4);
    sVar5 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::DescriptorProto_ExtensionRange>(value_01);
    _i = sVar5 + _i;
  }
  uVar2 = extension_size(this);
  _i = uVar2 + _i;
  for (i_5 = 0; i_5 < uVar2; i_5 = i_5 + 1) {
    pFVar4 = extension(this,i_5);
    sVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (pFVar4);
    _i = sVar5 + _i;
  }
  uVar2 = oneof_decl_size(this);
  _i = uVar2 + _i;
  for (i_6 = 0; i_6 < uVar2; i_6 = i_6 + 1) {
    value_02 = oneof_decl(this,i_6);
    sVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::OneofDescriptorProto>
                      (value_02);
    _i = sVar5 + _i;
  }
  uVar2 = reserved_range_size(this);
  _i = uVar2 + _i;
  for (n = 0; (uint)n < uVar2; n = n + 1) {
    value_03 = reserved_range(this,n);
    sVar5 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::DescriptorProto_ReservedRange>(value_03);
    _i = sVar5 + _i;
  }
  iVar3 = reserved_name_size(this);
  sVar5 = internal::FromIntSize(iVar3);
  _i = sVar5 + _i;
  cached_size = 0;
  iVar3 = reserved_name_size(this);
  for (; cached_size < iVar3; cached_size = cached_size + 1) {
    psVar6 = reserved_name_abi_cxx11_(this,cached_size);
    sVar5 = internal::WireFormatLite::StringSize(psVar6);
    _i = sVar5 + _i;
  }
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar6 = name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar6);
      _i = sVar5 + 1 + _i;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      sVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::MessageOptions>
                        (this->options_);
      _i = sVar5 + 1 + _i;
    }
  }
  iVar3 = internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t DescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  {
    unsigned int count = this->field_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->field(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  {
    unsigned int count = this->nested_type_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->nested_type(i));
    }
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  {
    unsigned int count = this->enum_type_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->enum_type(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  {
    unsigned int count = this->extension_range_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->extension_range(i));
    }
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  {
    unsigned int count = this->extension_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->extension(i));
    }
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  {
    unsigned int count = this->oneof_decl_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->oneof_decl(i));
    }
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  {
    unsigned int count = this->reserved_range_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->reserved_range(i));
    }
  }

  // repeated string reserved_name = 10;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->reserved_name_size());
  for (int i = 0, n = this->reserved_name_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->reserved_name(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}